

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> wabt::MakeUnique<wabt::Script>(void)

{
  Script *this;
  __uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true> in_RDI;
  
  this = (Script *)operator_new(0x50);
  memset(this,0,0x50);
  Script::Script(this);
  std::unique_ptr<wabt::Script,std::default_delete<wabt::Script>>::
  unique_ptr<std::default_delete<wabt::Script>,void>
            ((unique_ptr<wabt::Script,std::default_delete<wabt::Script>> *)
             in_RDI.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
             super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
         (tuple<wabt::Script_*,_std::default_delete<wabt::Script>_>)
         in_RDI.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
         super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
         super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}